

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O1

int pick_lock(obj *pick,int rx,int ry,boolean explicit,boolean loot_after)

{
  undefined1 *puVar1;
  ushort uVar2;
  monst *pmVar3;
  bool bVar4;
  long lVar5;
  boolean bVar6;
  char cVar7;
  schar sVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  char *pcVar15;
  level *plVar16;
  undefined7 in_register_00000081;
  monst *worm;
  char *pcVar17;
  obj *obj;
  long lVar18;
  rm *prVar19;
  int iVar20;
  bool bVar21;
  coord cc;
  schar dz;
  char qbuf [128];
  coord local_ea;
  long local_e8;
  schar local_de;
  schar local_dd;
  int local_dc;
  level *local_d8;
  monst *local_d0;
  char *local_c8;
  char *local_c0;
  char local_b8 [136];
  
  local_de = '\0';
  uVar2 = pick->otyp;
  uVar14 = (uint)(short)uVar2;
  if ((xlock_4 == 0) || (xlock_2 != uVar14)) {
    if (((youmonst.data)->mflags1 >> 0xd & 1) != 0) {
      pcVar10 = doname(pick);
      pline("You can\'t hold %s -- you have no hands!",pcVar10);
      return 0;
    }
    if ((0x10 < uVar2 - 0xe2) || ((0x10007U >> (uVar2 - 0xe2 & 0x1f) & 1) == 0)) {
      warning("picking lock with object %d?",(ulong)uVar14);
      return 0;
    }
    if (ry == 0 || rx == 0) {
      iVar9 = get_adjacent_loc((char *)0x0,"Invalid location!",u.ux,u.uy,&local_ea,&local_de);
      if (iVar9 == 0) {
        return 0;
      }
    }
    else {
      local_ea.x = (xchar)rx;
      local_ea.y = (xchar)ry;
    }
    local_d0 = (monst *)CONCAT44(local_d0._4_4_,(int)CONCAT71(in_register_00000081,loot_after));
    lVar18 = (long)local_ea.x;
    local_e8 = (long)local_ea.y;
    local_dc = (int)u.uy;
    local_dd = local_ea.x - u.ux;
    if (local_dd == '\0') {
      if (uVar2 != 0xf2 && local_ea.y != u.uy) goto LAB_001b488f;
LAB_001b48ca:
      if (local_de < '\0') {
        if (u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) {
          pcVar10 = "there";
          if ((youmonst.data)->mlet == '\x05') {
            pcVar10 = "here";
          }
        }
        else {
          pcVar10 = "here";
        }
        pcVar15 = "There isn\'t any sort of lock up %s.";
LAB_001b4a1f:
        pline(pcVar15,pcVar10);
LAB_001b4a26:
        iVar9 = 0;
LAB_001b4a29:
        bVar4 = false;
        lVar18 = local_e8;
      }
      else {
        bVar6 = is_lava(level,(int)u.ux,local_dc);
        if (bVar6 != '\0') {
          pcVar10 = xname(pick);
          pcVar15 = "Doing that would probably melt your %s.";
          goto LAB_001b4a1f;
        }
        bVar6 = is_pool(level,(int)u.ux,(int)u.uy);
        if ((bVar6 != '\0') && ((u._1052_1_ & 2) == 0)) {
          pline("The water has no lock.");
          goto LAB_001b4a26;
        }
        obj = level->objects[local_ea.x][local_ea.y];
        lVar18 = local_e8;
        if (obj == (obj *)0x0) {
          iVar9 = 0;
          bVar21 = false;
          iVar20 = 0;
        }
        else {
          local_c0 = "unlock";
          if (uVar14 == 0xe3) {
            local_c0 = "pick";
          }
          local_c8 = "it";
          if (uVar14 == 0xe3) {
            local_c8 = "its lock";
          }
          iVar20 = 0;
          do {
            if ((ushort)(obj->otyp - 0xdaU) < 3) {
              bVar6 = can_reach_floor();
              if (bVar6 == '\0') {
                pcVar10 = xname(obj);
                pcVar10 = the(pcVar10);
                pcVar15 = "You can\'t reach %s from up here.";
                goto LAB_001b4a1f;
              }
              pcVar10 = "its lock";
              pcVar15 = "fix";
              if ((*(uint *)&obj->field_0x4a >> 0xe & 1) == 0) {
                pcVar10 = "it";
                pcVar15 = "crack";
                if ((obj->otyp != 0xdc) &&
                   (pcVar10 = local_c8, pcVar15 = local_c0,
                   (*(uint *)&obj->field_0x4a >> 0xd & 1) == 0)) {
                  pcVar15 = "lock";
                  pcVar10 = "it";
                }
              }
              local_d8 = (level *)CONCAT44(local_d8._4_4_,iVar20 + 1);
              pcVar17 = doname(obj);
              pcVar11 = simple_typename((int)obj->otyp);
              pcVar11 = an(pcVar11);
              pcVar17 = safe_qbuf("",0x21,pcVar17,pcVar11,"a box");
              sprintf(local_b8,"There is %s here, %s %s?",pcVar17,pcVar15,pcVar10);
              cVar7 = yn_function(local_b8,"ynq",'q');
              lVar18 = local_e8;
              if (cVar7 == 'n') {
                iVar20 = (int)local_d8;
                goto LAB_001b4ba3;
              }
              if (cVar7 == 'q') {
                iVar9 = 0;
                goto LAB_001b50b7;
              }
              if ((uVar14 == 0xf2) || (obj->otyp != 0xdc)) {
                uVar13 = *(uint *)&obj->field_0x4a;
                if ((uVar13 >> 0xd & 1) == 0 && obj->otyp == 0xdc) {
                  pcVar10 = "You can\'t change the combination.";
                  goto LAB_001b50a9;
                }
                if ((uVar13 >> 0xe & 1) == 0) {
                  if ((uVar14 == 0xe4) && ((uVar13 & 0x2000) == 0)) {
                    pcVar10 = doname(pick);
                    pcVar15 = "You can\'t do that with %s.";
                    goto LAB_001b4a1f;
                  }
                  uVar13 = uVar14 & 0xff;
                  if (uVar13 < 0xe4) {
                    if (uVar13 == 0xe2) {
                      sVar8 = acurr(3);
                      iVar20 = sVar8 + 0x4b;
                    }
                    else {
                      iVar20 = 0;
                      if (uVar13 == 0xe3) {
                        sVar8 = acurr(3);
                        iVar20 = sVar8 * 4 + 0x19;
                        if (urole.malenum != 0x164) {
                          iVar20 = sVar8 * 4;
                        }
                      }
                    }
                  }
                  else if (uVar13 == 0xf2) {
                    sVar8 = acurr(3);
                    iVar20 = 5;
                    if (urole.malenum == 0x164) {
                      iVar20 = sVar8 * 2 + 5;
                    }
                  }
                  else {
                    iVar20 = 0;
                    if (uVar13 == 0xe4) {
                      sVar8 = acurr(3);
                      iVar20 = sVar8 + 0x14;
                      if (urole.malenum != 0x164) {
                        iVar20 = (int)sVar8;
                      }
                    }
                  }
                  iVar9 = iVar20 / 2;
                  if ((obj->field_0x4a & 1) == 0) {
                    iVar9 = iVar20;
                  }
                  xlock_0 = (rm *)0x0;
                  xlock_5 = SUB81(local_d0,0);
                  bVar21 = cVar7 == 'y';
                  lVar18 = local_e8;
                  iVar20 = (int)local_d8;
                  xlock_1 = obj;
                  xlock_2 = uVar14;
                  goto LAB_001b4c0e;
                }
                pcVar10 = doname(pick);
                pline("You can\'t fix its broken lock with %s.",pcVar10);
              }
              else {
                pcVar10 = "You aren\'t sure how to go about opening the safe that way.";
LAB_001b50a9:
                pline(pcVar10);
              }
              iVar9 = 0;
              lVar18 = local_e8;
              goto LAB_001b50b7;
            }
LAB_001b4ba3:
            obj = (obj->v).v_nexthere;
          } while (obj != (obj *)0x0);
          iVar9 = 0;
          bVar21 = false;
        }
LAB_001b4c0e:
        bVar4 = true;
        if (!bVar21) {
          if (iVar20 != 0) {
LAB_001b50b7:
            bVar4 = false;
            goto LAB_001b4a2e;
          }
          pline("There doesn\'t seem to be any sort of pickable lock here.");
          goto LAB_001b4a29;
        }
      }
LAB_001b4a2e:
      cVar7 = (char)lVar18;
      sVar8 = picklock_dx;
      iVar20 = xlock_3;
      picklock_dx = local_dd;
    }
    else {
      if (uVar14 == 0xf2) goto LAB_001b48ca;
LAB_001b488f:
      if ((u.utrap != 0) && (u.utraptype == 1)) {
        pcVar10 = "You can\'t reach over the edge of the pit.";
        goto LAB_001b48ac;
      }
      pmVar3 = level->monsters[lVar18][local_e8];
      worm = (monst *)0x0;
      if ((pmVar3 != (monst *)0x0) && ((pmVar3->field_0x61 & 2) == 0)) {
        worm = pmVar3;
      }
      plVar16 = level;
      if (worm == (monst *)0x0) {
LAB_001b4cfc:
        lVar5 = local_e8;
        prVar19 = plVar16->locations[lVar18] + local_e8;
        if (plVar16->locations[lVar18][local_e8].typ != '\x17') {
          iVar9 = is_drawbridge_wall((int)local_ea.x,(int)local_ea.y);
          if (iVar9 < 0) {
            if ((u.uprops[0x1e].intrinsic == 0) &&
               (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)))) {
              pcVar10 = "see";
            }
            else if (ublindf == (obj *)0x0) {
              pcVar10 = "feel";
            }
            else {
              pcVar10 = "feel";
              if (ublindf->oartifact == '\x1d') {
                pcVar10 = "see";
              }
            }
            pcVar15 = "You %s no door there.";
          }
          else {
            if (((u.uprops[0x1e].intrinsic == 0) &&
                ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)) {
              pcVar10 = "see";
            }
            else if (ublindf == (obj *)0x0) {
              pcVar10 = "feel";
            }
            else {
              pcVar10 = "feel";
              if (ublindf->oartifact == '\x1d') {
                pcVar10 = "see";
              }
            }
            pcVar15 = "You %s no lock on the drawbridge.";
          }
          goto LAB_001b4f98;
        }
        uVar13 = *(uint *)&plVar16->locations[lVar18][local_e8].field_0x6;
        uVar12 = uVar13 >> 4 & 0x1f;
        if (uVar12 != 2) {
          if (uVar12 == 1) {
            pcVar10 = "This door is broken.";
            goto LAB_001b48ac;
          }
          if (uVar12 == 0) {
            pcVar10 = "This doorway has no door.";
            goto LAB_001b48ac;
          }
          if ((uVar14 != 0xe4) || ((uVar13 & 0x80) != 0)) {
            puVar1 = &level->locations[(int)local_ea.x][(int)local_ea.y].field_0x6;
            *(uint *)puVar1 = *(uint *)puVar1 | 1;
            map_background(local_ea.x,local_ea.y,1);
            pcVar10 = "Unl";
            if ((plVar16->locations[lVar18][lVar5].field_0x6 & 0x80) == 0) {
              pcVar10 = "L";
            }
            pcVar17 = "";
            pcVar15 = " with ";
            if (explicit == '\0') {
              pcVar15 = "";
            }
            else {
              pcVar17 = doname(pick);
            }
            sprintf(local_b8,"%sock it%s%s?",pcVar10,pcVar15,pcVar17);
            cVar7 = yn_function(local_b8,"yn",'n');
            iVar9 = 0;
            bVar4 = false;
            if (cVar7 != 'n') {
              if ((char)uVar2 == -0x1e) {
                sVar8 = acurr(3);
                iVar20 = sVar8 + 0x46;
              }
              else {
                if ((uVar14 & 0xff) == 0xe3) {
                  sVar8 = acurr(3);
                  iVar9 = sVar8 * 3;
                  iVar20 = sVar8 * 3 + 0x1e;
                }
                else {
                  iVar20 = 0;
                  if ((uVar14 & 0xff) != 0xe4) goto LAB_001b5146;
                  sVar8 = acurr(3);
                  iVar9 = sVar8 * 2;
                  iVar20 = sVar8 * 2 + 0x14;
                }
                if (urole.malenum != 0x164) {
                  iVar20 = iVar9;
                }
              }
LAB_001b5146:
              xlock_1 = (obj *)0x0;
              xlock_5 = 0;
              xlock_0 = prVar19;
              bVar6 = on_level(&level->z,&dungeon_topology.d_advcal_level);
              bVar4 = true;
              iVar9 = iVar20;
              if ((bVar6 != '\0') && (iVar9 = -1, bVar4 = true, uVar14 == 0xe2)) {
                bVar4 = false;
                pline("Your key doesn\'t seem to fit.");
                iVar9 = iVar20;
              }
            }
            goto LAB_001b4fa7;
          }
          pline("You can\'t lock a door with a credit card.");
          goto LAB_001b4f9f;
        }
        pcVar10 = "You cannot lock an open door.";
LAB_001b48ac:
        pline(pcVar10);
        iVar9 = 0;
        bVar4 = false;
      }
      else {
        if (worm->wormno == '\0') {
          if (((viz_array[worm->my][worm->mx] & 2U) != 0) ||
             ((((u.uprops[0x1e].intrinsic == 0 &&
                (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
              (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                (((youmonst.data)->mflags3 & 0x100) != 0)) &&
               (((viz_array[worm->my][worm->mx] & 1U) != 0 && ((worm->data->mflags3 & 0x200) != 0)))
               ))))) goto LAB_001b4ca9;
          goto LAB_001b4cfc;
        }
        local_d8 = level;
        local_d0 = worm;
        bVar6 = worm_known(level,worm);
        plVar16 = local_d8;
        worm = local_d0;
        if (bVar6 == '\0') goto LAB_001b4cfc;
LAB_001b4ca9:
        uVar13 = *(uint *)&worm->field_0x60;
        if ((((uVar13 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
           (u.uprops[0xc].extrinsic == 0)) {
          if (((uVar13 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
          goto LAB_001b4ce3;
          goto LAB_001b4cfc;
        }
        if ((uVar13 & 0x280) != 0) goto LAB_001b4cfc;
LAB_001b4ce3:
        if (((u._1052_1_ & 0x20) != 0) || ((byte)(worm->m_ap_type - 1) < 2)) goto LAB_001b4cfc;
        if ((uVar14 == 0xe4) && (((uVar13 >> 0x19 & 1) != 0 || (worm->data == mons + 0x11e)))) {
          verbalize("No checks, no credit, no problem.");
          goto LAB_001b4f9f;
        }
        pcVar10 = mon_nam(worm);
        pcVar15 = "I don\'t think %s would appreciate that.";
LAB_001b4f98:
        pline(pcVar15,pcVar10);
LAB_001b4f9f:
        bVar4 = false;
        iVar9 = 0;
      }
LAB_001b4fa7:
      cVar7 = (char)local_e8;
      sVar8 = picklock_dx;
      iVar20 = xlock_3;
      picklock_dx = local_dd;
    }
    xlock_3 = iVar9;
    if (!bVar4) {
      picklock_dx = sVar8;
      xlock_3 = iVar20;
      return 0;
    }
    picklock_dy = cVar7 - (char)local_dc;
    flags.move = '\0';
    xlock_4 = 0;
    xlock_2 = uVar14;
    local_dd = picklock_dx;
    pcVar10 = lock_action();
LAB_001b4ff4:
    set_occupation(picklock,pcVar10,0);
    iVar9 = 1;
  }
  else {
    if (((youmonst.data)->mflags1 >> 0xd & 1) == 0) {
      if ((xlock_1 == (obj *)0x0) || (bVar6 = can_reach_floor(), bVar6 != '\0')) {
        pcVar10 = lock_action();
        pline("You resume your attempt at %s.",pcVar10);
        goto LAB_001b4ff4;
      }
      pcVar15 = "reach the";
      pcVar10 = "lock";
    }
    else {
      pcVar10 = "key";
      if (uVar14 == 0xe3) {
        pcVar10 = "pick";
      }
      pcVar15 = "card";
      if (uVar14 != 0xe4) {
        pcVar15 = pcVar10;
      }
      pcVar10 = "stethoscope";
      if (uVar14 != 0xf2) {
        pcVar10 = pcVar15;
      }
      pcVar15 = "hold the";
    }
    iVar9 = 0;
    pline("Unfortunately, you can no longer %s %s.",pcVar15,pcVar10);
    xlock_2 = 0;
    xlock_3 = 0;
    xlock_4 = 0;
    xlock_5 = 0;
    xlock_0 = (rm *)0x0;
    xlock_1 = (obj *)0x0;
    picklock_dy = '\0';
    picklock_dx = '\0';
  }
  return iVar9;
}

Assistant:

int pick_lock(struct obj *pick, int rx, int ry, boolean explicit, boolean loot_after)
{
	/* rx and ry are passed only from the use-stethoscope stuff */
	int picktyp, c, ch;
	coord cc;
	struct rm	*door;
	struct obj	*otmp;
	char qbuf[QBUFSZ];
	schar dx, dy, dz = 0;

	picktyp = pick->otyp;

	/* check whether we're resuming an interrupted previous attempt */
	if (xlock.usedtime && picktyp == xlock.picktyp) {
	    static const char no_longer[] = "Unfortunately, you can no longer %s %s.";

	    if (nohands(youmonst.data)) {
		const char *what = (picktyp == LOCK_PICK) ? "pick" : "key";
		if (picktyp == CREDIT_CARD) what = "card";
		if (picktyp == STETHOSCOPE) what = "stethoscope";
		pline(no_longer, "hold the", what);
		reset_pick();
		return 0;
	    } else if (xlock.box && !can_reach_floor()) {
		pline(no_longer, "reach the", "lock");
		reset_pick();
		return 0;
	    } else {
		const char *action = lock_action();
		pline("You resume your attempt at %s.", action);
		set_occupation(picklock, action, 0);
		return 1;
	    }
	}

	if (nohands(youmonst.data)) {
		pline("You can't hold %s -- you have no hands!", doname(pick));
		return 0;
	}

	if (picktyp != LOCK_PICK &&
		picktyp != STETHOSCOPE &&
		picktyp != CREDIT_CARD &&
		picktyp != SKELETON_KEY) {
		warning("picking lock with object %d?", picktyp);
		return 0;
	}
	ch = 0;		/* lint suppression */

	/* If this is a stethoscope, we know where we came from. */
	if (rx != 0 && ry != 0) {
	    cc.x = rx;
	    cc.y = ry;
	} else {
	    if (!get_adjacent_loc(NULL, "Invalid location!", u.ux, u.uy, &cc, &dz))
		return 0;
	}

	dx = cc.x - u.ux;
	dy = cc.y - u.uy;

	/* Very clumsy special case for this, but forcing the player to
	 * a)pply > just to open a safe, when a)pply . works in all other cases? */
	if ((cc.x == u.ux && cc.y == u.uy) || picktyp == STETHOSCOPE) {	/* pick lock on a container */
	    const char *verb;
	    boolean it;
	    int count;

	    if (dz < 0) {
		pline("There isn't any sort of lock up %s.",
		      Levitation ? "here" : "there");
		return 0;
	    } else if (is_lava(level, u.ux, u.uy)) {
		pline("Doing that would probably melt your %s.",
		      xname(pick));
		return 0;
	    } else if (is_pool(level, u.ux, u.uy) && !Underwater) {
		pline("The water has no lock.");
		return 0;
	    }

	    count = 0;
	    c = 'n';			/* in case there are no boxes here */
	    for (otmp = level->objects[cc.x][cc.y]; otmp; otmp = otmp->nexthere)
		if (Is_box(otmp)) {
		    ++count;
		    if (!can_reach_floor()) {
			pline("You can't reach %s from up here.", the(xname(otmp)));
			return 0;
		    }
		    it = 0;
		    if (otmp->obroken) verb = "fix";
		    else if (otmp->otyp == IRON_SAFE) verb = "crack", it = 1;
		    else if (!otmp->olocked) verb = "lock", it = 1;
		    else if (picktyp != LOCK_PICK) verb = "unlock", it = 1;
		    else verb = "pick";
		    sprintf(qbuf, "There is %s here, %s %s?",
			    safe_qbuf("", sizeof("There is  here, unlock its lock?"),
				      doname(otmp), an(simple_typename(otmp->otyp)), "a box"),
			    verb, it ? "it" : "its lock");

		    c = ynq(qbuf);
		    if (c == 'q') return 0;
		    if (c == 'n') continue;

		    if (otmp->otyp == IRON_SAFE && picktyp != STETHOSCOPE) {
			pline("You aren't sure how to go about opening the safe that way.");
			return 0;
		    }
		    if (!otmp->olocked && otmp->otyp == IRON_SAFE) {
			pline("You can't change the combination.");
			return 0;
		    }

		    if (otmp->obroken) {
			pline("You can't fix its broken lock with %s.", doname(pick));
			return 0;
		    }
		    else if (picktyp == CREDIT_CARD && !otmp->olocked) {
			/* credit cards are only good for unlocking */
			pline("You can't do that with %s.", doname(pick));
			return 0;
		    }
		    switch(picktyp) {
			case CREDIT_CARD:
			    ch = ACURR(A_DEX) + 20*Role_if (PM_ROGUE);
			    break;
			case LOCK_PICK:
			    ch = 4*ACURR(A_DEX) + 25*Role_if (PM_ROGUE);
			    break;
			case SKELETON_KEY:
			    ch = 75 + ACURR(A_DEX);
			    break;
			case STETHOSCOPE:
			    ch = 5 + 2*ACURR(A_DEX)*Role_if(PM_ROGUE);
			    break;
			default:	ch = 0;
		    }
		    if (otmp->cursed) ch /= 2;

		    xlock.picktyp = picktyp;
		    xlock.box = otmp;
		    xlock.door = 0;
		    xlock.loot_unlocked = loot_after;
		    break;
		}
	    if (c != 'y') {
		if (!count)
		    pline("There doesn't seem to be any sort of pickable lock here.");
		return 0;		/* decided against all boxes */
	    }
	} else {			/* pick the lock in a door */
	    struct monst *mtmp;

	    if (u.utrap && u.utraptype == TT_PIT) {
		pline("You can't reach over the edge of the pit.");
		return 0;
	    }

	    door = &level->locations[cc.x][cc.y];
	    if ((mtmp = m_at(level, cc.x, cc.y)) && canseemon(level, mtmp)
			&& mtmp->m_ap_type != M_AP_FURNITURE
			&& mtmp->m_ap_type != M_AP_OBJECT) {
		if (picktyp == CREDIT_CARD &&
		    (mtmp->isshk || mtmp->data == &mons[PM_ORACLE]))
		    verbalize("No checks, no credit, no problem.");
		else
		    pline("I don't think %s would appreciate that.", mon_nam(mtmp));
		return 0;
	    }
	    if (!IS_DOOR(door->typ)) {
		if (is_drawbridge_wall(cc.x,cc.y) >= 0)
		    pline("You %s no lock on the drawbridge.",
				Blind ? "feel" : "see");
		else
		    pline("You %s no door there.",
				Blind ? "feel" : "see");
		return 0;
	    }
	    switch (door->doormask) {
		case D_NODOOR:
		    pline("This doorway has no door.");
		    return 0;
		case D_ISOPEN:
		    pline("You cannot lock an open door.");
		    return 0;
		case D_BROKEN:
		    pline("This door is broken.");
		    return 0;
		default:
		    /* credit cards are only good for unlocking */
		    if (picktyp == CREDIT_CARD && !(door->doormask & D_LOCKED)) {
			pline("You can't lock a door with a credit card.");
			return 0;
		    }

		    /*
		     * At this point, the player knows that the door
		     * is a door, and whether it's locked, but not
		     * whether it's trapped; to do this, we set the
		     * mem_door_l flag and call map_background(),
		     * which will clear it if necessary (i.e. not a door
		     * after all).
		     */
		    level->locations[cc.x][cc.y].mem_door_l = 1;
		    map_background(cc.x, cc.y, TRUE);

		    sprintf(qbuf,"%sock it%s%s?",
			(door->doormask & D_LOCKED) ? "Unl" : "L",
			explicit ? " with " : "",
			explicit ? doname(pick) : "");

		    c = yn(qbuf);
		    if (c == 'n') return 0;

		    switch(picktyp) {
			case CREDIT_CARD:
			    ch = 2*ACURR(A_DEX) + 20*Role_if (PM_ROGUE);
			    break;
			case LOCK_PICK:
			    ch = 3*ACURR(A_DEX) + 30*Role_if (PM_ROGUE);
			    break;
			case SKELETON_KEY:
			    ch = 70 + ACURR(A_DEX);
			    break;
			default:    ch = 0;
		    }
		    xlock.door = door;
		    xlock.box = 0;
		    xlock.loot_unlocked = FALSE;

		    /* ALI - Artifact doors */
		    if (artifact_door(level, cc.x, cc.y)) {
			if (picktyp == SKELETON_KEY) {
			    pline("Your key doesn't seem to fit.");
			    return 0;
			} else {
			    /* -1 == 0% chance */
			    ch = -1;
			}
		    }
	    }
	}
	flags.move = 0;
	xlock.chance = ch;
	xlock.picktyp = picktyp;
	xlock.usedtime = 0;
	picklock_dx = dx;
	picklock_dy = dy;
	set_occupation(picklock, lock_action(), 0);
	return 1;
}